

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void qclab::printMatrix4x4<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  complex<double> in_stack_00000000;
  
  if (mat->size_ == 4) {
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  __assert_fail("mat.rows() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x6a,
                "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void printMatrix4x4( const T& mat ) {
    assert( mat.rows() == 4 ) ;
    assert( mat.cols() == 4 ) ;
    print( mat(0,0) ); print( mat(0,1) ); print( mat(0,2) ); print( mat(0,3) );
    std::cout << std::endl ;
    print( mat(1,0) ); print( mat(1,1) ); print( mat(1,2) ); print( mat(1,3) );
    std::cout << std::endl ;
    print( mat(2,0) ); print( mat(2,1) ); print( mat(2,2) ); print( mat(2,3) );
    std::cout << std::endl ;
    print( mat(3,0) ); print( mat(3,1) ); print( mat(3,2) ); print( mat(3,3) );
    std::cout << std::endl ;
  }